

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall argo::lexer::throw_number_exception(lexer *this,int c)

{
  json_parser_exception *this_00;
  size_t sVar1;
  
  this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  if (c == -1) {
    sVar1 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(this_00,unexpected_eof_e,sVar1);
  }
  else {
    sVar1 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(this_00,invalid_number_e,(char)c,sVar1);
  }
  __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
}

Assistant:

void lexer::throw_number_exception(int c)
{
    if (c == EOF)
    {
        throw json_parser_exception(json_parser_exception::unexpected_eof_e, m_reader.get_byte_index());
    }
    else
    {
        throw json_parser_exception(
                json_parser_exception::invalid_number_e,
                static_cast<char>(c),
                m_reader.get_byte_index());
    }
}